

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  string *psVar5;
  ostream *this;
  MidiEventList *pMVar6;
  MidiEvent *pMVar7;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  MidiEvent *local_1a8;
  int local_1a0;
  int local_19c;
  int event;
  int track;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> notes;
  MidiFile midifile;
  undefined1 local_100 [8];
  Options options;
  char **argv_local;
  int argc_local;
  
  options.m_extraArgv_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  smf::Options::Options((Options *)local_100,argc,argv);
  checkOptions((Options *)local_100);
  smf::MidiFile::MidiFile
            ((MidiFile *)
             &notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  iVar2 = smf::Options::getArgCount((Options *)local_100);
  if (iVar2 == 2) {
    psVar5 = smf::Options::getArg_abi_cxx11_((Options *)local_100,1);
    smf::MidiFile::read((MidiFile *)
                        &notes.
                         super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(int)psVar5,__buf,in_RCX)
    ;
  }
  else {
    iVar2 = smf::Options::getArgCount((Options *)local_100);
    if (iVar2 != 1) {
      std::operator<<((ostream *)&std::cerr,"Need one optional MIDI file (or standard input), ");
      this = std::operator<<((ostream *)&std::cerr,"and one output");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    psVar5 = smf::Options::getArg_abi_cxx11_((Options *)local_100,1);
    smf::MidiFile::read((MidiFile *)
                        &notes.
                         super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(int)psVar5,__buf_00,
                        in_RCX);
  }
  smf::MidiFile::linkNotePairs
            ((MidiFile *)
             &notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::vector
            ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&event);
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
            ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&event,0x1e240);
  local_19c = 0;
  while( true ) {
    iVar2 = local_19c;
    uVar3 = smf::MidiFile::getNumTracks
                      ((MidiFile *)
                       &notes.
                        super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    __n = (size_t)uVar3;
    if ((int)uVar3 <= iVar2) break;
    for (local_1a0 = 0; iVar2 = local_1a0,
        iVar4 = smf::MidiFile::getNumEvents
                          ((MidiFile *)
                           &notes.
                            super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_19c),
        iVar2 < iVar4; local_1a0 = local_1a0 + 1) {
      pMVar6 = smf::MidiFile::operator[]
                         ((MidiFile *)
                          &notes.
                           super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,local_19c);
      pMVar7 = smf::MidiEventList::operator[](pMVar6,local_1a0);
      bVar1 = smf::MidiMessage::isNoteOn(&pMVar7->super_MidiMessage);
      if (bVar1) {
        pMVar6 = smf::MidiFile::operator[]
                           ((MidiFile *)
                            &notes.
                             super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_19c);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,local_1a0);
        iVar2 = smf::MidiEvent::isLinked(pMVar7);
        if (iVar2 != 0) {
          pMVar6 = smf::MidiFile::operator[]
                             ((MidiFile *)
                              &notes.
                               super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_19c);
          local_1a8 = smf::MidiEventList::operator[](pMVar6,local_1a0);
          std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back
                    ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&event,
                     &local_1a8);
        }
      }
    }
    local_19c = local_19c + 1;
  }
  if (reverseQ == 0) {
    randomizeNotes((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&event);
  }
  else {
    reverseNotes((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&event);
  }
  iVar2 = smf::Options::getArgCount((Options *)local_100);
  if (iVar2 == 2) {
    psVar5 = smf::Options::getArg_abi_cxx11_((Options *)local_100,2);
    smf::MidiFile::write
              ((MidiFile *)
               &notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(int)psVar5,__buf_01,__n);
  }
  else {
    psVar5 = smf::Options::getArg_abi_cxx11_((Options *)local_100,1);
    smf::MidiFile::write
              ((MidiFile *)
               &notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(int)psVar5,__buf_02,__n);
  }
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::~vector
            ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&event);
  smf::MidiFile::~MidiFile
            ((MidiFile *)
             &notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  smf::Options::~Options((Options *)local_100);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   Options options(argc, argv);
   checkOptions(options);

   MidiFile midifile;
   if (options.getArgCount() == 2) {
      midifile.read(options.getArg(1));
   } else if (options.getArgCount() == 1) {
      midifile.read(options.getArg(1));
   } else {
      cerr << "Need one optional MIDI file (or standard input), ";
      cerr << "and one output" << endl;
      exit(1);
   }

   midifile.linkNotePairs();
   vector<MidiEvent*> notes;
   notes.reserve(123456);
   int track, event;
   for (track=0; track<midifile.getNumTracks(); track++) {
      for (event=0; event<midifile.getNumEvents(track); event++) {
         if (midifile[track][event].isNoteOn()) {
            if (midifile[track][event].isLinked()) {
               notes.push_back(&midifile[track][event]);
            }
         }
      }
   }

   if (reverseQ) {
      reverseNotes(notes);
   } else {
      randomizeNotes(notes);
   }

   if (options.getArgCount() == 2) {
      midifile.write(options.getArg(2));
   } else {
      midifile.write(options.getArg(1));
   }

   return 0;
}